

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectionalAtom.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::DirectionalAtom::getGrad(DirectionalAtom *this)

{
  double *pdVar1;
  reference pvVar2;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar3;
  int j_1;
  int j;
  Vector3d epsi;
  Vector3d etheta;
  Vector3d ephi;
  RealType stheta;
  RealType ctheta;
  RealType sphi;
  RealType cphi;
  RealType theta;
  RealType phi;
  Vector3d myEuler;
  Vector3d torque;
  Vector3d force;
  vector<double,_std::allocator<double>_> *grad;
  Vector3<double> *in_stack_fffffffffffffd58;
  double dVar4;
  Vector3<double> *in_stack_fffffffffffffd60;
  StuntDouble *in_stack_fffffffffffffd68;
  value_type_conflict2 *in_stack_fffffffffffffd70;
  size_type in_stack_fffffffffffffd78;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd80;
  SquareMatrix3<double> *in_stack_fffffffffffffdb8;
  uint local_190;
  uint local_18c;
  Vector<double,_3U> local_f8;
  Vector<double,_3U> local_e0;
  Vector<double,_3U> local_c8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  Vector<double,_3U> local_80;
  Vector<double,_3U> local_68;
  Vector<double,_3U> local_50 [2];
  undefined8 local_20;
  undefined1 local_11;
  
  local_11 = 0;
  local_20 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x26cba3);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
             (allocator_type *)in_stack_fffffffffffffd68);
  std::allocator<double>::~allocator((allocator<double> *)0x26cbd4);
  Vector3<double>::Vector3((Vector3<double> *)0x26cbe1);
  Vector3<double>::Vector3((Vector3<double> *)0x26cbf0);
  Vector3<double>::Vector3((Vector3<double> *)0x26cbff);
  Vector3<double>::Vector3((Vector3<double> *)0x26cc0e);
  Vector3<double>::Vector3((Vector3<double> *)0x26cc1d);
  Vector3<double>::Vector3((Vector3<double> *)0x26cc2c);
  StuntDouble::getFrc(in_stack_fffffffffffffd68);
  Vector3<double>::operator=(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  StuntDouble::getTrq(in_stack_fffffffffffffd68);
  Vector3<double>::operator=(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  StuntDouble::getA(in_stack_fffffffffffffd68);
  SquareMatrix3<double>::toEulerAngles(in_stack_fffffffffffffdb8);
  Vector3<double>::operator=(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x26ccdc);
  pdVar1 = Vector<double,_3U>::operator[](&local_80,0);
  local_88 = *pdVar1;
  pdVar1 = Vector<double,_3U>::operator[](&local_80,1);
  local_90 = *pdVar1;
  local_98 = cos(local_88);
  local_a0 = sin(local_88);
  local_a8 = cos(local_90);
  local_b0 = sin(local_90);
  if (ABS(local_b0) < 1e-09) {
    local_b0 = 1e-09;
  }
  dVar3 = (-local_a0 * local_a8) / local_b0;
  pdVar1 = Vector<double,_3U>::operator[](&local_c8,0);
  *pdVar1 = dVar3;
  dVar3 = (local_98 * local_a8) / local_b0;
  pdVar1 = Vector<double,_3U>::operator[](&local_c8,1);
  *pdVar1 = dVar3;
  pdVar1 = Vector<double,_3U>::operator[](&local_c8,2);
  dVar4 = local_98;
  *pdVar1 = 1.0;
  pdVar1 = Vector<double,_3U>::operator[](&local_e0,0);
  dVar3 = local_a0;
  *pdVar1 = dVar4;
  pdVar1 = Vector<double,_3U>::operator[](&local_e0,1);
  *pdVar1 = dVar3;
  pdVar1 = Vector<double,_3U>::operator[](&local_e0,2);
  *pdVar1 = 0.0;
  dVar3 = local_a0 / local_b0;
  pdVar1 = Vector<double,_3U>::operator[](&local_f8,0);
  *pdVar1 = dVar3;
  dVar3 = -local_98 / local_b0;
  pdVar1 = Vector<double,_3U>::operator[](&local_f8,1);
  *pdVar1 = dVar3;
  pdVar1 = Vector<double,_3U>::operator[](&local_f8,2);
  *pdVar1 = 0.0;
  for (local_18c = 0; (int)local_18c < 3; local_18c = local_18c + 1) {
    pdVar1 = Vector<double,_3U>::operator[](local_50,local_18c);
    dVar3 = -*pdVar1;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)(int)local_18c);
    *pvVar2 = dVar3;
  }
  for (local_190 = 0; (int)local_190 < 3; local_190 = local_190 + 1) {
    pdVar1 = Vector<double,_3U>::operator[](&local_68,local_190);
    dVar3 = *pdVar1;
    pdVar1 = Vector<double,_3U>::operator[](&local_c8,local_190);
    dVar4 = *pdVar1;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,3);
    *pvVar2 = *pvVar2 - dVar3 * dVar4;
    pdVar1 = Vector<double,_3U>::operator[](&local_68,local_190);
    dVar3 = *pdVar1;
    pdVar1 = Vector<double,_3U>::operator[](&local_e0,local_190);
    dVar4 = *pdVar1;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,4);
    *pvVar2 = *pvVar2 - dVar3 * dVar4;
    pdVar1 = Vector<double,_3U>::operator[](&local_68,local_190);
    dVar3 = *pdVar1;
    pdVar1 = Vector<double,_3U>::operator[](&local_f8,local_190);
    dVar4 = *pdVar1;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,5);
    *pvVar2 = -dVar3 * dVar4 + *pvVar2;
  }
  return in_RDI;
}

Assistant:

std::vector<RealType> DirectionalAtom::getGrad() {
    std::vector<RealType> grad(6, 0.0);
    Vector3d force;
    Vector3d torque;
    Vector3d myEuler;
    RealType phi, theta;
    RealType cphi, sphi, ctheta, stheta;
    Vector3d ephi;
    Vector3d etheta;
    Vector3d epsi;

    force  = getFrc();
    torque = getTrq();

    myEuler = getA().toEulerAngles();

    phi   = myEuler[0];
    theta = myEuler[1];

    cphi   = cos(phi);
    sphi   = sin(phi);
    ctheta = cos(theta);
    stheta = sin(theta);

    if (fabs(stheta) < 1.0E-9) { stheta = 1.0E-9; }

    ephi[0] = -sphi * ctheta / stheta;
    ephi[1] = cphi * ctheta / stheta;
    ephi[2] = 1.0;

    etheta[0] = cphi;
    etheta[1] = sphi;
    etheta[2] = 0.0;

    epsi[0] = sphi / stheta;
    epsi[1] = -cphi / stheta;
    epsi[2] = 0.0;

    // gradient is equal to -force
    for (int j = 0; j < 3; j++)
      grad[j] = -force[j];

    for (int j = 0; j < 3; j++) {
      grad[3] -= torque[j] * ephi[j];
      grad[4] -= torque[j] * etheta[j];
      grad[5] -= torque[j] * epsi[j];
    }

    return grad;
  }